

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdot.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  double dVar1;
  pointer paVar2;
  int l;
  int iVar3;
  int iVar4;
  undefined8 *puVar5;
  vector<block_q4_0,_std::allocator<block_q4_0>_> *pvVar6;
  long lVar7;
  undefined8 *puVar8;
  long lVar9;
  int k;
  long lVar10;
  int l_1;
  uint8_t *puVar11;
  int j;
  pointer pfVar12;
  int8_t *piVar13;
  bool bVar14;
  bool bVar15;
  float mean;
  undefined4 uVar16;
  float fVar17;
  float fVar18;
  undefined4 uVar19;
  double dVar20;
  double dVar21;
  int local_14c8;
  float result;
  double local_14c0;
  double local_14b8;
  double local_14b0;
  double local_14a8;
  double local_14a0;
  double local_1498;
  double local_1490;
  double local_1488;
  double local_1480;
  double local_1478;
  int local_146c;
  vector<block_q4_0,_std::allocator<block_q4_0>_> q40;
  vector<float,_std::allocator<float>_> y1;
  vector<block_q4_1,_std::allocator<block_q4_1>_> q41;
  vector<block_q8_0,_std::allocator<block_q8_0>_> q8;
  vector<float,_std::allocator<float>_> x1;
  mt19937 rndm;
  
  bVar15 = true;
  if (argc < 2) {
    local_14c8 = 10;
  }
  else {
    local_14c8 = atoi(argv[1]);
    if (argc != 2) {
      iVar3 = atoi(argv[2]);
      bVar14 = iVar3 == 0;
      if (3 < (uint)argc) {
        iVar4 = atoi(argv[3]);
        bVar15 = iVar4 == 0;
        if (iVar3 != 0 && !bVar15) {
          puts("It is not possible to use Q4_1 quantization and scalar implementations");
          return 1;
        }
      }
      goto LAB_001022f8;
    }
  }
  bVar14 = true;
LAB_001022f8:
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&rndm,0x4d2);
  std::vector<float,_std::allocator<float>_>::vector(&x1,0x40000,(allocator_type *)&y1);
  std::vector<float,_std::allocator<float>_>::vector(&y1,0x40000,(allocator_type *)&q40);
  puVar5 = (undefined8 *)ggml_get_type_traits_cpu(bVar15 ^ 3);
  q40.super__Vector_base<block_q4_0,_std::allocator<block_q4_0>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  q40.super__Vector_base<block_q4_0,_std::allocator<block_q4_0>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  q40.super__Vector_base<block_q4_0,_std::allocator<block_q4_0>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  q41.super__Vector_base<block_q4_1,_std::allocator<block_q4_1>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  q41.super__Vector_base<block_q4_1,_std::allocator<block_q4_1>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  q41.super__Vector_base<block_q4_1,_std::allocator<block_q4_1>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (bVar15 == false) {
    std::vector<block_q4_1,_std::allocator<block_q4_1>_>::resize(&q41,0x2000);
  }
  else {
    std::vector<block_q4_0,_std::allocator<block_q4_0>_>::resize(&q40,0x2000);
  }
  std::vector<block_q8_0,_std::allocator<block_q8_0>_>::vector(&q8,0x2000,(allocator_type *)&result)
  ;
  iVar3 = 0;
  local_146c = 0;
  if (0 < local_14c8) {
    local_146c = local_14c8;
  }
  fVar17 = 0.0;
  local_1490 = 0.0;
  local_14a0 = 0.0;
  local_14b8 = 0.0;
  local_1488 = 0.0;
  local_14c0 = 0.0;
  local_1498 = 0.0;
  local_14a8 = 0.0;
  local_14b0 = 0.0;
  local_1478 = 0.0;
  for (; iVar3 != local_146c; iVar3 = iVar3 + 1) {
    fillRandomGaussianFloats(&x1,&rndm,fVar17);
    fillRandomGaussianFloats(&y1,&rndm,mean);
    for (lVar10 = 0; lVar10 != 0x40000; lVar10 = lVar10 + 1) {
      local_1478 = local_1478 +
                   (double)(x1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar10] *
                           y1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar10]);
    }
    pvVar6 = (vector<block_q4_0,_std::allocator<block_q4_0>_> *)&q41;
    if (bVar15 != false) {
      pvVar6 = &q40;
    }
    (*(code *)*puVar5)(x1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       (pvVar6->super__Vector_base<block_q4_0,_std::allocator<block_q4_0>_>)._M_impl
                       .super__Vector_impl_data._M_start,0x40000);
    lVar10 = std::chrono::_V2::system_clock::now();
    if (bVar15 == false) {
      dVar21 = dot41(0x2000,q41.super__Vector_base<block_q4_1,_std::allocator<block_q4_1>_>._M_impl.
                            super__Vector_impl_data._M_start,
                     y1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start);
      uVar16 = SUB84(dVar21,0);
      uVar19 = (undefined4)((ulong)dVar21 >> 0x20);
    }
    else {
      dVar21 = dot(0x2000,q40.super__Vector_base<block_q4_0,_std::allocator<block_q4_0>_>._M_impl.
                          super__Vector_impl_data._M_start,
                   y1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start);
      uVar16 = SUB84(dVar21,0);
      uVar19 = (undefined4)((ulong)dVar21 >> 0x20);
    }
    lVar7 = std::chrono::_V2::system_clock::now();
    local_1480 = (double)(lVar7 - lVar10) * 0.001;
    lVar10 = std::chrono::_V2::system_clock::now();
    paVar2 = q8.super__Vector_base<block_q8_0,_std::allocator<block_q8_0>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (bVar14) {
      puVar8 = (undefined8 *)ggml_get_type_traits_cpu(*(undefined4 *)(puVar5 + 2));
      (*(code *)*puVar8)(y1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         q8.super__Vector_base<block_q8_0,_std::allocator<block_q8_0>_>._M_impl.
                         super__Vector_impl_data._M_start,0x40000);
      pvVar6 = (vector<block_q4_0,_std::allocator<block_q4_0>_> *)&q41;
      if (bVar15 != false) {
        pvVar6 = &q40;
      }
      (*(code *)puVar5[1])
                (0x40000,&result,0,
                 (pvVar6->super__Vector_base<block_q4_0,_std::allocator<block_q4_0>_>)._M_impl.
                 super__Vector_impl_data._M_start,0,
                 q8.super__Vector_base<block_q8_0,_std::allocator<block_q8_0>_>._M_impl.
                 super__Vector_impl_data._M_start,0,1);
    }
    else {
      piVar13 = (q8.super__Vector_base<block_q8_0,_std::allocator<block_q8_0>_>._M_impl.
                 super__Vector_impl_data._M_start)->qs;
      pfVar12 = y1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
                ._M_start;
      for (lVar7 = 0; lVar7 != 0x2000; lVar7 = lVar7 + 1) {
        fVar17 = 0.0;
        for (lVar9 = 0; lVar9 != 0x20; lVar9 = lVar9 + 1) {
          fVar18 = ABS(pfVar12[lVar9]);
          if (ABS(pfVar12[lVar9]) <= fVar17) {
            fVar18 = fVar17;
          }
          fVar17 = fVar18;
        }
        fVar17 = fVar17 / 127.0;
        paVar2[lVar7].d = fVar17;
        for (lVar9 = 0; lVar9 != 0x20; lVar9 = lVar9 + 1) {
          fVar18 = roundf(pfVar12[lVar9] * (float)(-(uint)(fVar17 != 0.0) & (uint)(1.0 / fVar17)));
          piVar13[lVar9] = (int8_t)(int)fVar18;
        }
        pfVar12 = pfVar12 + 0x20;
        piVar13 = piVar13 + 0x24;
      }
      piVar13 = (q8.super__Vector_base<block_q8_0,_std::allocator<block_q8_0>_>._M_impl.
                 super__Vector_impl_data._M_start)->qs + 1;
      puVar11 = (q40.super__Vector_base<block_q4_0,_std::allocator<block_q4_0>_>._M_impl.
                 super__Vector_impl_data._M_start)->qs;
      result = 0.0;
      for (lVar7 = 0; lVar7 != 0x2000; lVar7 = lVar7 + 1) {
        iVar4 = 0;
        for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
          iVar4 = (int)piVar13[lVar9 * 2] * ((puVar11[lVar9] >> 4) - 8) + iVar4 +
                  (int)piVar13[lVar9 * 2 + -1] * ((puVar11[lVar9] & 0xf) - 8);
        }
        result = result + (float)iVar4 *
                          q40.super__Vector_base<block_q4_0,_std::allocator<block_q4_0>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar7].d *
                          q8.super__Vector_base<block_q8_0,_std::allocator<block_q8_0>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar7].d;
        piVar13 = piVar13 + 0x24;
        puVar11 = puVar11 + 0x14;
      }
    }
    local_14a8 = local_14a8 + (double)CONCAT44(uVar19,uVar16);
    uVar16 = SUB84(local_1480,0);
    uVar19 = (undefined4)((ulong)local_1480 >> 0x20);
    local_14b8 = local_14b8 + local_1480;
    local_1488 = local_1488 + local_1480 * local_1480;
    if (local_1480 <= local_14a0) {
      uVar16 = SUB84(local_14a0,0);
      uVar19 = (undefined4)((ulong)local_14a0 >> 0x20);
    }
    local_1480 = (double)CONCAT44(uVar19,uVar16);
    local_14b0 = local_14b0 + (double)result;
    lVar7 = std::chrono::_V2::system_clock::now();
    dVar21 = (double)(lVar7 - lVar10) * 0.001;
    local_14c0 = local_14c0 + dVar21;
    local_1498 = local_1498 + dVar21 * dVar21;
    if (dVar21 <= local_1490) {
      dVar21 = local_1490;
    }
    local_14a0 = local_1480;
    fVar17 = SUB84(local_1480,0);
    local_1490 = dVar21;
  }
  dVar20 = (double)local_14c8;
  local_14a8 = local_14a8 / dVar20;
  local_14b0 = local_14b0 / dVar20;
  printf("Exact result: <dot> = %g\n",SUB84(local_1478 / dVar20,0));
  printf("<dot> = %g, %g\n",SUB84(local_14a8,0),local_14b0);
  dVar1 = local_14b8 / dVar20;
  uVar16 = SUB84(dVar1,0);
  dVar21 = local_1488 / dVar20 - dVar1 * dVar1;
  if (0.0 < dVar21) {
    if (dVar21 < 0.0) {
      local_14b8 = dVar1;
      dVar21 = sqrt(dVar21);
      uVar16 = SUB84(local_14b8,0);
    }
    else {
      dVar21 = SQRT(dVar21);
    }
  }
  printf("time = %g +/- %g us. maxt = %g us\n",uVar16,dVar21,SUB84(local_14a0,0));
  dVar1 = local_14c0 / dVar20;
  uVar16 = SUB84(dVar1,0);
  dVar21 = local_1498 / dVar20 - dVar1 * dVar1;
  if (0.0 < dVar21) {
    if (dVar21 < 0.0) {
      local_14c0 = dVar1;
      dVar21 = sqrt(dVar21);
      uVar16 = SUB84(local_14c0,0);
    }
    else {
      dVar21 = SQRT(dVar21);
    }
  }
  printf("timeq = %g +/- %g us. maxt = %g us\n",uVar16,dVar21,SUB84(local_1490,0));
  std::_Vector_base<block_q8_0,_std::allocator<block_q8_0>_>::~_Vector_base
            (&q8.super__Vector_base<block_q8_0,_std::allocator<block_q8_0>_>);
  std::_Vector_base<block_q4_1,_std::allocator<block_q4_1>_>::~_Vector_base
            (&q41.super__Vector_base<block_q4_1,_std::allocator<block_q4_1>_>);
  std::_Vector_base<block_q4_0,_std::allocator<block_q4_0>_>::~_Vector_base
            (&q40.super__Vector_base<block_q4_0,_std::allocator<block_q4_0>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&y1.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&x1.super__Vector_base<float,_std::allocator<float>_>);
  return 0;
}

Assistant:

int main(int argc, char** argv) {

    int nloop = argc > 1 ? atoi(argv[1]) : 10;
    bool scalar = argc > 2 ? atoi(argv[2]) : false;
    bool useQ4_1 = argc > 3 ? atoi(argv[3]) : false;

    if (scalar && useQ4_1) {
        printf("It is not possible to use Q4_1 quantization and scalar implementations\n");
        return 1;
    }

    std::mt19937 rndm(1234);

    std::vector<float> x1(kVecSize), y1(kVecSize);
    int n4 = useQ4_1 ? kVecSize / QK4_1 : kVecSize / QK4_0; n4 = 64*((n4 + 63)/64);
    int n8 = kVecSize / QK8_0; n8 = 64*((n8 + 63)/64);

    const auto * funcs_cpu = ggml_get_type_traits_cpu(useQ4_1 ? GGML_TYPE_Q4_1 : GGML_TYPE_Q4_0);

    std::vector<block_q4_0> q40;
    std::vector<block_q4_1> q41;
    if (useQ4_1) q41.resize(n4);
    else q40.resize(n4);
    std::vector<block_q8_0> q8(n8);
    double sumt = 0, sumt2 = 0, maxt = 0;
    double sumqt = 0, sumqt2 = 0, maxqt = 0;
    double sum = 0, sumq = 0, exactSum = 0;
    for (int iloop=0; iloop<nloop; ++iloop) {

        // Fill vector x with random numbers
        fillRandomGaussianFloats(x1, rndm);

        // Fill vector y with random numbers
        fillRandomGaussianFloats(y1, rndm);

        // Compute the exact dot product
        for (int k=0; k<kVecSize; ++k) exactSum += x1[k]*y1[k];

        // quantize x.
        // Note, we do not include this in the timing as in practical application
        // we already have the quantized model weights.
        if (useQ4_1) {
            funcs_cpu->from_float(x1.data(), q41.data(), kVecSize);
        } else {
            funcs_cpu->from_float(x1.data(), q40.data(), kVecSize);
        }

        // Now measure time the dot product needs using the "scalar" version above
        auto t1 = std::chrono::high_resolution_clock::now();
        if (useQ4_1) sum += dot41(kVecSize / QK4_1, q41.data(), y1.data());
        else sum += dot(kVecSize / QK4_0, q40.data(), y1.data());
        auto t2 = std::chrono::high_resolution_clock::now();
        auto t = 1e-3*std::chrono::duration_cast<std::chrono::nanoseconds>(t2-t1).count();
        sumt += t; sumt2 += t*t; maxt = std::max(maxt, t);

        // And now measure the time needed to quantize y and perform the dot product with the quantized y
        t1 = std::chrono::high_resolution_clock::now();
        float result;
        if (scalar) {
            quantize_row_q8_0_reference(y1.data(), q8.data(), kVecSize);
            dot_q4_q8(kVecSize, &result, q40.data(), q8.data());
        }
        else {
            const auto * vdot = ggml_get_type_traits_cpu(funcs_cpu->vec_dot_type);
            vdot->from_float(y1.data(), q8.data(), kVecSize);
            if (useQ4_1) funcs_cpu->vec_dot(kVecSize, &result, 0, q41.data(), 0, q8.data(), 0, 1);
            else funcs_cpu->vec_dot(kVecSize, &result, 0, q40.data(), 0, q8.data(), 0, 1);
        }
        sumq += result;
        t2 = std::chrono::high_resolution_clock::now();
        t = 1e-3*std::chrono::duration_cast<std::chrono::nanoseconds>(t2-t1).count();
        sumqt += t; sumqt2 += t*t; maxqt = std::max(maxqt, t);

    }

    // Report the time (and the average of the dot products so the compiler does not come up with the idea
    // of optimizing away the function calls after figuring that the result is not used).
    sum /= nloop; sumq /= nloop;
    exactSum /= nloop;
    printf("Exact result: <dot> = %g\n",exactSum);
    printf("<dot> = %g, %g\n",sum,sumq);
    sumt /= nloop; sumt2 /= nloop; sumt2 -= sumt*sumt;
    if (sumt2 > 0) sumt2 = sqrt(sumt2);
    printf("time = %g +/- %g us. maxt = %g us\n",sumt,sumt2,maxt);
    sumqt /= nloop; sumqt2 /= nloop; sumqt2 -= sumqt*sumqt;
    if (sumqt2 > 0) sumqt2 = sqrt(sumqt2);
    printf("timeq = %g +/- %g us. maxt = %g us\n",sumqt,sumqt2,maxqt);
    return 0;
}